

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O2

GenericPackage * __thiscall
ASDCP::MXF::GenericPackage::InitFromTLVSet(GenericPackage *this,TLVReader *TLVSet)

{
  int iVar1;
  MDDEntry *pMVar2;
  MDDEntry *in_RDX;
  TLVReader local_80;
  
  if (TLVSet[1].super_MemIOReader.m_p != (byte_t *)0x0) {
    InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                MDD_GenericPackage_PackageUID);
      TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
      if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
        pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                  MDD_GenericPackage_Name);
        TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
        Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
        Kumu::Result_t::~Result_t((Result_t *)&local_80);
        iVar1 = *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket;
        *(bool *)&TLVSet[3].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             iVar1 == Kumu::RESULT_OK;
        if (-1 < iVar1) {
          pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                    MDD_GenericPackage_PackageCreationDate);
          TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
          Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
          Kumu::Result_t::~Result_t((Result_t *)&local_80);
          if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
            pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                      MDD_GenericPackage_PackageModifiedDate);
            TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
            Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
            Kumu::Result_t::~Result_t((Result_t *)&local_80);
            if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
              pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                                        MDD_GenericPackage_Tracks);
              TLVReader::ReadObject(&local_80,in_RDX,(IArchive *)pMVar2);
              Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
              Kumu::Result_t::~Result_t((Result_t *)&local_80);
            }
          }
        }
      }
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1da,
                "virtual ASDCP::Result_t ASDCP::MXF::GenericPackage::InitFromTLVSet(TLVReader &)");
}

Assistant:

ASDCP::Result_t
GenericPackage::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericPackage, PackageUID));
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(GenericPackage, Name));
    Name.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericPackage, PackageCreationDate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericPackage, PackageModifiedDate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericPackage, Tracks));
  return result;
}